

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCreateTable(Btree *p,int *piTable,int flags)

{
  BtShared *pBt;
  Pgno PVar1;
  int iVar2;
  MemPage *pPage;
  Pgno pgno;
  u8 eType;
  int local_64;
  MemPage *pRoot;
  uint local_54;
  Pgno local_50;
  Pgno pgnoMove;
  MemPage *pPageMove;
  MemPage *local_40;
  uint *local_38;
  uint uVar3;
  
  sqlite3BtreeEnter(p);
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar2 = allocateBtreePage(pBt,&pRoot,&local_54,1,'\0');
    pPage = pRoot;
    local_64 = iVar2;
    if (iVar2 != 0) goto LAB_00137385;
LAB_0013731f:
    zeroPage(pPage,(flags & 1U) * 3 + 10);
    sqlite3PagerUnref(pPage->pDbPage);
    *piTable = local_54;
    iVar2 = 0;
  }
  else {
    local_38 = (uint *)piTable;
    invalidateAllOverflowCache(pBt);
    sqlite3BtreeGetMeta(p,4,&local_54);
    iVar2 = sqlite3PendingByte;
    do {
      do {
        uVar3 = local_54;
        pgno = uVar3 + 1;
        PVar1 = ptrmapPageno(pBt,pgno);
        local_54 = pgno;
      } while (pgno == PVar1);
    } while (uVar3 == (uint)iVar2 / pBt->pageSize);
    iVar2 = allocateBtreePage(pBt,&pPageMove,&pgnoMove,pgno,'\x01');
    local_64 = iVar2;
    if (iVar2 != 0) goto LAB_00137385;
    if (pgnoMove == pgno) {
      pRoot = pPageMove;
      pPage = pPageMove;
LAB_001372b0:
      ptrmapPut(pBt,pgno,'\x01',0,&local_64);
      iVar2 = local_64;
      if ((local_64 == 0) &&
         (iVar2 = sqlite3BtreeUpdateMeta(p,4,pgno), piTable = (int *)local_38, local_64 = iVar2,
         iVar2 == 0)) goto LAB_0013731f;
    }
    else {
      eType = '\0';
      local_50 = 0;
      iVar2 = saveAllCursors(pBt,0,(BtCursor *)0x0);
      releasePage(pPageMove);
      if ((iVar2 != 0) || (iVar2 = btreeGetPage(pBt,pgno,&pRoot,0), iVar2 != 0)) goto LAB_00137385;
      iVar2 = ptrmapGet(pBt,pgno,&eType,&local_50);
      if ((byte)(eType - 1) < 2) {
        iVar2 = sqlite3CorruptError(0x10a06);
        pPage = pRoot;
      }
      else {
        pPage = pRoot;
        if (iVar2 == 0) {
          local_40 = pRoot;
          iVar2 = relocatePage(pBt,pRoot,eType,local_50,pgnoMove,0);
          releasePage(local_40);
          if ((iVar2 != 0) || (iVar2 = btreeGetPage(pBt,pgno,&pRoot,0), pPage = pRoot, iVar2 != 0))
          goto LAB_00137385;
          iVar2 = sqlite3PagerWrite(pRoot->pDbPage);
          local_64 = iVar2;
          if (iVar2 != 0) {
            releasePageNotNull(pPage);
            goto LAB_00137385;
          }
          goto LAB_001372b0;
        }
      }
    }
    releasePage(pPage);
  }
LAB_00137385:
  sqlite3BtreeLeave(p);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, int *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}